

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCacheStore(Parse *pParse,int iTab,int iCol,int iReg)

{
  int iVar1;
  yColCache *pyVar2;
  yColCache *local_30;
  yColCache *p;
  int idxLru;
  int minLru;
  int i;
  int iReg_local;
  int iCol_local;
  int iTab_local;
  Parse *pParse_local;
  
  if ((pParse->db->dbOptFlags & 2) == 0) {
    local_30 = pParse->aColCache;
    for (idxLru = 0; idxLru < 10; idxLru = idxLru + 1) {
      if (local_30->iReg == 0) {
        local_30->iLevel = pParse->iCacheLevel;
        local_30->iTable = iTab;
        local_30->iColumn = iCol;
        local_30->iReg = iReg;
        local_30->tempReg = '\0';
        iVar1 = pParse->iCacheCnt;
        pParse->iCacheCnt = iVar1 + 1;
        local_30->lru = iVar1;
        return;
      }
      local_30 = local_30 + 1;
    }
    p._4_4_ = 0x7fffffff;
    p._0_4_ = -1;
    local_30 = pParse->aColCache;
    for (idxLru = 0; idxLru < 10; idxLru = idxLru + 1) {
      if (local_30->lru < p._4_4_) {
        p._0_4_ = idxLru;
        p._4_4_ = local_30->lru;
      }
      local_30 = local_30 + 1;
    }
    if (-1 < (int)p) {
      pyVar2 = pParse->aColCache + (int)p;
      pyVar2->iLevel = pParse->iCacheLevel;
      pyVar2->iTable = iTab;
      pyVar2->iColumn = iCol;
      pyVar2->iReg = iReg;
      pyVar2->tempReg = '\0';
      iVar1 = pParse->iCacheCnt;
      pParse->iCacheCnt = iVar1 + 1;
      pyVar2->lru = iVar1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheStore(Parse *pParse, int iTab, int iCol, int iReg){
  int i;
  int minLru;
  int idxLru;
  struct yColCache *p;

  assert( iReg>0 );  /* Register numbers are always positive */
  assert( iCol>=-1 && iCol<32768 );  /* Finite column numbers */

  /* The SQLITE_ColumnCache flag disables the column cache.  This is used
  ** for testing only - to verify that SQLite always gets the same answer
  ** with and without the column cache.
  */
  if( OptimizationDisabled(pParse->db, SQLITE_ColumnCache) ) return;

  /* First replace any existing entry.
  **
  ** Actually, the way the column cache is currently used, we are guaranteed
  ** that the object will never already be in cache.  Verify this guarantee.
  */
#ifndef NDEBUG
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    assert( p->iReg==0 || p->iTable!=iTab || p->iColumn!=iCol );
  }
#endif

  /* Find an empty slot and replace it */
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->iReg==0 ){
      p->iLevel = pParse->iCacheLevel;
      p->iTable = iTab;
      p->iColumn = iCol;
      p->iReg = iReg;
      p->tempReg = 0;
      p->lru = pParse->iCacheCnt++;
      return;
    }
  }

  /* Replace the last recently used */
  minLru = 0x7fffffff;
  idxLru = -1;
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->lru<minLru ){
      idxLru = i;
      minLru = p->lru;
    }
  }
  if( ALWAYS(idxLru>=0) ){
    p = &pParse->aColCache[idxLru];
    p->iLevel = pParse->iCacheLevel;
    p->iTable = iTab;
    p->iColumn = iCol;
    p->iReg = iReg;
    p->tempReg = 0;
    p->lru = pParse->iCacheCnt++;
    return;
  }
}